

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O3

void __thiscall blc::tools::VFile::~VFile(VFile *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011acb0;
  std::fstream::close();
  pcVar1 = (this->_fileName)._M_dataplus._M_p;
  paVar2 = &(this->_fileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->_cache)._M_dataplus._M_p;
  paVar2 = &(this->_cache).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::fstream::~fstream(&this->_file);
  return;
}

Assistant:

blc::tools::VFile::~VFile() {
	this->_file.close();
}